

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QTableWidgetItem * __thiscall QTableModel::takeItem(QTableModel *this,int row,int column)

{
  QTableWidgetItem *pQVar1;
  reference ppQVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QTableWidgetItem *itm;
  long i;
  QModelIndex ind;
  qsizetype in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tableIndex((QTableModel *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  pQVar1 = QList<QTableWidgetItem_*>::value
                     ((QList<QTableWidgetItem_*> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    pQVar1->view = (QTableWidget *)0x0;
    pQVar1->d->id = -1;
    ppQVar2 = QList<QTableWidgetItem_*>::operator[]
                        ((QList<QTableWidgetItem_*> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78);
    *ppQVar2 = (QTableWidgetItem *)0x0;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8d503e);
    (**(code **)(*(long *)in_RDI + 0x60))(&local_20,in_RDI,in_ESI,in_EDX,local_38);
    memset(local_50,0,0x18);
    QList<int>::QList((QList<int> *)0x8d5076);
    QAbstractItemModel::dataChanged(in_RDI,(QModelIndex *)&local_20,(QList_conflict2 *)&local_20);
    QList<int>::~QList((QList<int> *)0x8d5097);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTableWidgetItem *QTableModel::takeItem(int row, int column)
{
    long i = tableIndex(row, column);
    QTableWidgetItem *itm = tableItems.value(i);
    if (itm) {
        itm->view = nullptr;
        itm->d->id = -1;
        tableItems[i] = 0;
        const QModelIndex ind = index(row, column);
        emit dataChanged(ind, ind);
    }
    return itm;
}